

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall sznet::net::TcpServer::start(TcpServer *this)

{
  int iVar1;
  Acceptor *pAVar2;
  EventLoop *this_00;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  LOCK();
  iVar1 = (this->m_started).super___atomic_base<int>._M_i;
  (this->m_started).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  if (iVar1 == 0) {
    EventLoopThreadPool::start
              ((this->m_threadPool).
               super___shared_ptr<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->m_threadInitCallback);
    pAVar2 = (this->m_acceptor)._M_t.
             super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>
             .super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl;
    if (pAVar2->m_listenning == true) {
      __assert_fail("!m_acceptor->listenning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
                    ,0x37,"void sznet::net::TcpServer::start()");
    }
    this_00 = this->m_loop;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    pcStack_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = Acceptor::listen;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(Acceptor **)((long)local_48._M_unused._0_8_ + 0x10) = pAVar2;
    pcStack_30 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::Acceptor::*(sznet::net::Acceptor_*))()>_>
                 ::_M_invoke;
    pcStack_38 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::Acceptor::*(sznet::net::Acceptor_*))()>_>
                 ::_M_manager;
    EventLoop::runInLoop(this_00,(Functor *)&local_48);
    if (pcStack_38 != (code *)0x0) {
      (*pcStack_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void TcpServer::start()
{
	if (m_started.exchange(1) == 0)
	{
		m_threadPool->start(m_threadInitCallback);
		assert(!m_acceptor->listenning());
		// listen��������ȷ����m_loop�����߳���ִ��
		m_loop->runInLoop(std::bind(&Acceptor::listen, get_pointer(m_acceptor)));
	}
}